

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O0

int __thiscall t_html_generator::print_type(t_html_generator *this,t_type *ttype)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  t_type *ptVar4;
  t_program *ptVar5;
  string *psVar6;
  string *psVar7;
  ostream *poVar8;
  long lVar9;
  bool bVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  string local_98 [8];
  string type_name;
  string prog_name;
  allocator local_41;
  string local_40 [32];
  long local_20;
  size_type len;
  t_type *ttype_local;
  t_html_generator *this_local;
  
  local_20 = 0;
  len = (size_type)ttype;
  ttype_local = (t_type *)this;
  std::operator<<((ostream *)&this->f_out_,"<code>");
  uVar3 = (**(code **)(*(long *)len + 0x68))();
  if ((uVar3 & 1) == 0) {
    uVar3 = (**(code **)(*(long *)len + 0x28))();
    if ((uVar3 & 1) == 0) {
      ptVar5 = t_type::get_program((t_type *)len);
      psVar6 = t_program::get_name_abi_cxx11_(ptVar5);
      std::__cxx11::string::string((string *)(type_name.field_2._M_local_buf + 8),(string *)psVar6);
      psVar7 = (string *)(**(code **)(*(long *)len + 0x18))();
      std::__cxx11::string::string(local_98,psVar7);
      poVar8 = std::operator<<((ostream *)&this->f_out_,"<a href=\"");
      std::operator+(&local_d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&type_name.field_2 + 8),".html");
      make_file_link(&local_b8,this,&local_d8);
      poVar8 = std::operator<<(poVar8,(string *)&local_b8);
      std::operator<<(poVar8,"#");
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      bVar1 = (**(code **)(*(long *)len + 0x48))();
      if ((bVar1 & 1) == 0) {
        bVar1 = (**(code **)(*(long *)len + 0x58))();
        if (((bVar1 & 1) == 0) && (bVar1 = (**(code **)(*(long *)len + 0x60))(), (bVar1 & 1) == 0))
        {
          bVar1 = (**(code **)(*(long *)len + 0x50))();
          if ((bVar1 & 1) == 0) {
            bVar1 = (**(code **)(*(long *)len + 0x88))();
            if ((bVar1 & 1) != 0) {
              std::operator<<((ostream *)&this->f_out_,"Svc_");
            }
          }
          else {
            std::operator<<((ostream *)&this->f_out_,"Enum_");
          }
        }
        else {
          std::operator<<((ostream *)&this->f_out_,"Struct_");
        }
      }
      else {
        std::operator<<((ostream *)&this->f_out_,"Struct_");
      }
      poVar8 = std::operator<<((ostream *)&this->f_out_,local_98);
      std::operator<<(poVar8,"\">");
      local_20 = std::__cxx11::string::size();
      ptVar5 = t_type::get_program((t_type *)len);
      if (ptVar5 != (this->super_t_generator).program_) {
        poVar8 = std::operator<<((ostream *)&this->f_out_,
                                 (string *)(type_name.field_2._M_local_buf + 8));
        std::operator<<(poVar8,".");
        lVar9 = std::__cxx11::string::size();
        local_20 = lVar9 + 1 + local_20;
      }
      poVar8 = std::operator<<((ostream *)&this->f_out_,local_98);
      std::operator<<(poVar8,"</a>");
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string((string *)(type_name.field_2._M_local_buf + 8));
    }
    else {
      uVar3 = (**(code **)(*(long *)len + 0x38))();
      bVar10 = (uVar3 & 1) != 0;
      if (bVar10) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_40,"binary",&local_41);
      }
      else {
        psVar7 = (string *)(**(code **)(*(long *)len + 0x18))();
        std::__cxx11::string::string(local_40,psVar7);
      }
      std::operator<<((ostream *)&this->f_out_,local_40);
      std::__cxx11::string::~string(local_40);
      if (bVar10) {
        std::allocator<char>::~allocator((allocator<char> *)&local_41);
      }
      (**(code **)(*(long *)len + 0x18))();
      local_20 = std::__cxx11::string::size();
    }
  }
  else {
    uVar3 = (**(code **)(*(long *)len + 0x70))();
    if ((uVar3 & 1) == 0) {
      uVar3 = (**(code **)(*(long *)len + 0x78))();
      if ((uVar3 & 1) == 0) {
        uVar3 = (**(code **)(*(long *)len + 0x80))();
        if ((uVar3 & 1) != 0) {
          std::operator<<((ostream *)&this->f_out_,"map&lt;");
          ptVar4 = t_map::get_key_type((t_map *)len);
          iVar2 = print_type(this,ptVar4);
          local_20 = (long)(iVar2 + 5);
          std::operator<<((ostream *)&this->f_out_,", ");
          ptVar4 = t_map::get_val_type((t_map *)len);
          iVar2 = print_type(this,ptVar4);
          local_20 = iVar2 + local_20;
          std::operator<<((ostream *)&this->f_out_,"&gt;");
        }
      }
      else {
        std::operator<<((ostream *)&this->f_out_,"set&lt;");
        ptVar4 = t_set::get_elem_type((t_set *)len);
        iVar2 = print_type(this,ptVar4);
        local_20 = (long)(iVar2 + 5);
        std::operator<<((ostream *)&this->f_out_,"&gt;");
      }
    }
    else {
      std::operator<<((ostream *)&this->f_out_,"list&lt;");
      ptVar4 = t_list::get_elem_type((t_list *)len);
      iVar2 = print_type(this,ptVar4);
      local_20 = (long)(iVar2 + 6);
      std::operator<<((ostream *)&this->f_out_,"&gt;");
    }
  }
  std::operator<<((ostream *)&this->f_out_,"</code>");
  return (int)local_20;
}

Assistant:

int t_html_generator::print_type(t_type* ttype) {
  std::string::size_type len = 0;
  f_out_ << "<code>";
  if (ttype->is_container()) {
    if (ttype->is_list()) {
      f_out_ << "list&lt;";
      len = 6 + print_type(((t_list*)ttype)->get_elem_type());
      f_out_ << "&gt;";
    } else if (ttype->is_set()) {
      f_out_ << "set&lt;";
      len = 5 + print_type(((t_set*)ttype)->get_elem_type());
      f_out_ << "&gt;";
    } else if (ttype->is_map()) {
      f_out_ << "map&lt;";
      len = 5 + print_type(((t_map*)ttype)->get_key_type());
      f_out_ << ", ";
      len += print_type(((t_map*)ttype)->get_val_type());
      f_out_ << "&gt;";
    }
  } else if (ttype->is_base_type()) {
    f_out_ << (ttype->is_binary() ? "binary" : ttype->get_name());
    len = ttype->get_name().size();
  } else {
    string prog_name = ttype->get_program()->get_name();
    string type_name = ttype->get_name();
    f_out_ << "<a href=\"" << make_file_link(prog_name + ".html") << "#";
    if (ttype->is_typedef()) {
      f_out_ << "Struct_";
    } else if (ttype->is_struct() || ttype->is_xception()) {
      f_out_ << "Struct_";
    } else if (ttype->is_enum()) {
      f_out_ << "Enum_";
    } else if (ttype->is_service()) {
      f_out_ << "Svc_";
    }
    f_out_ << type_name << "\">";
    len = type_name.size();
    if (ttype->get_program() != program_) {
      f_out_ << prog_name << ".";
      len += prog_name.size() + 1;
    }
    f_out_ << type_name << "</a>";
  }
  f_out_ << "</code>";
  return (int)len;
}